

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O2

void __thiscall cmTryRunCommand::RunExecutable(cmTryRunCommand *this,string *runArgs,string *out)

{
  cmMakefile *this_00;
  pointer pbVar1;
  bool bVar2;
  string *arg;
  pointer pbVar3;
  string *this_01;
  int retVal;
  char retChar [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string finalCommand;
  
  retVal = -1;
  finalCommand._M_dataplus._M_p = (pointer)&finalCommand.field_2;
  finalCommand._M_string_length = 0;
  finalCommand.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)retChar,"CMAKE_CROSSCOMPILING_EMULATOR",(allocator<char> *)&emulatorWithArgs)
  ;
  arg = cmMakefile::GetSafeDefinition(this_00,(string *)retChar);
  std::__cxx11::string::~string((string *)retChar);
  if (arg->_M_string_length != 0) {
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(arg,&emulatorWithArgs,false);
    cmSystemTools::ConvertToRunCommandPath
              ((string *)retChar,
               emulatorWithArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::append((string *)&finalCommand);
    std::__cxx11::string::~string((string *)retChar);
    std::__cxx11::string::append((char *)&finalCommand);
    pbVar1 = emulatorWithArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = emulatorWithArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar3 = pbVar3 + 1, pbVar3 != pbVar1) {
      std::__cxx11::string::append((char *)&finalCommand);
      std::__cxx11::string::append((string *)&finalCommand);
      std::__cxx11::string::append((char *)&finalCommand);
      std::__cxx11::string::append((char *)&finalCommand);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&emulatorWithArgs);
  }
  cmSystemTools::ConvertToRunCommandPath
            ((string *)retChar,&(this->super_cmCoreTryCompile).OutputFile);
  std::__cxx11::string::append((string *)&finalCommand);
  this_01 = (string *)retChar;
  std::__cxx11::string::~string(this_01);
  if (runArgs->_M_string_length != 0) {
    std::__cxx11::string::append((string *)&finalCommand);
  }
  bVar2 = cmSystemTools::RunSingleCommand
                    (&finalCommand,out,out,&retVal,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0);
  if (bVar2) {
    sprintf((char *)this_01,"%i",(ulong)(uint)retVal);
  }
  else {
    this_01 = (string *)0x45c1f8;
  }
  cmMakefile::AddCacheDefinition
            ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&this->RunResultVariable,
             (char *)this_01,"Result of TRY_RUN",INTERNAL,false);
  std::__cxx11::string::~string((string *)&finalCommand);
  return;
}

Assistant:

void cmTryRunCommand::RunExecutable(const std::string& runArgs,
                                    std::string* out)
{
  int retVal = -1;

  std::string finalCommand;
  const std::string& emulator =
    this->Makefile->GetSafeDefinition("CMAKE_CROSSCOMPILING_EMULATOR");
  if (!emulator.empty()) {
    std::vector<std::string> emulatorWithArgs;
    cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
    finalCommand +=
      cmSystemTools::ConvertToRunCommandPath(emulatorWithArgs[0]);
    finalCommand += " ";
    for (std::string const& arg : cmMakeRange(emulatorWithArgs).advance(1)) {
      finalCommand += "\"";
      finalCommand += arg;
      finalCommand += "\"";
      finalCommand += " ";
    }
  }
  finalCommand += cmSystemTools::ConvertToRunCommandPath(this->OutputFile);
  if (!runArgs.empty()) {
    finalCommand += runArgs;
  }
  bool worked = cmSystemTools::RunSingleCommand(
    finalCommand, out, out, &retVal, nullptr, cmSystemTools::OUTPUT_NONE,
    cmDuration::zero());
  // set the run var
  char retChar[16];
  const char* retStr;
  if (worked) {
    sprintf(retChar, "%i", retVal);
    retStr = retChar;
  } else {
    retStr = "FAILED_TO_RUN";
  }
  this->Makefile->AddCacheDefinition(this->RunResultVariable, retStr,
                                     "Result of TRY_RUN",
                                     cmStateEnums::INTERNAL);
}